

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_writeKeyValuePair
                 (qpTestLog *log,char *elementName,char *name,char *description,char *unit,
                 qpKeyValueTag tag,char *text)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  deBool dVar4;
  ulong uVar5;
  bool bVar6;
  qpXmlAttribute attribs [8];
  
  pcVar1 = s_qpTagMap[(int)tag].string;
  deMutex_lock(log->lock);
  bVar6 = name != (char *)0x0;
  if (bVar6) {
    attribs[0].name = "Name";
    attribs[0].type = QP_XML_ATTRIBUTE_STRING;
    attribs[0].intValue = -0x2a6;
    attribs[0].boolValue = -1;
    attribs[0].stringValue = name;
  }
  uVar2 = (uint)bVar6;
  if (description != (char *)0x0) {
    uVar2 = uVar2 + 1;
    attribs[bVar6].name = "Description";
    attribs[bVar6].type = QP_XML_ATTRIBUTE_STRING;
    attribs[bVar6].stringValue = description;
    attribs[bVar6].intValue = -0x2a6;
    attribs[bVar6].boolValue = -1;
  }
  uVar3 = uVar2;
  if (pcVar1 != (char *)0x0) {
    uVar3 = uVar2 + 1;
    uVar5 = (ulong)(uVar2 << 5);
    *(char **)((long)&attribs[0].name + uVar5) = "Tag";
    *(undefined4 *)((long)&attribs[0].type + uVar5) = 0;
    *(char **)((long)&attribs[0].stringValue + uVar5) = pcVar1;
    *(undefined8 *)((long)&attribs[0].intValue + uVar5) = 0xfffffffffffffd5a;
  }
  uVar2 = uVar3;
  if (unit != (char *)0x0) {
    uVar2 = uVar3 + 1;
    uVar5 = (ulong)(uVar3 << 5);
    *(char **)((long)&attribs[0].name + uVar5) = "Unit";
    *(undefined4 *)((long)&attribs[0].type + uVar5) = 0;
    *(char **)((long)&attribs[0].stringValue + uVar5) = unit;
    *(undefined8 *)((long)&attribs[0].intValue + uVar5) = 0xfffffffffffffd5a;
  }
  dVar4 = qpXmlWriter_startElement(log->writer,elementName,uVar2,attribs);
  if (((dVar4 == 0) || (dVar4 = qpXmlWriter_writeString(log->writer,text), dVar4 == 0)) ||
     (dVar4 = qpXmlWriter_endElement(log->writer,elementName), dVar4 == 0)) {
    dVar4 = 0;
    qpPrintf("qpTestLog_writeKeyValuePair(): Writing XML failed\n");
  }
  else {
    dVar4 = 1;
  }
  deMutex_unlock(log->lock);
  return dVar4;
}

Assistant:

static deBool qpTestLog_writeKeyValuePair (qpTestLog* log, const char* elementName, const char* name, const char* description, const char* unit, qpKeyValueTag tag, const char* text)
{
	const char*		tagString = QP_LOOKUP_STRING(s_qpTagMap, tag);
	qpXmlAttribute	attribs[8];
	int				numAttribs = 0;

	DE_ASSERT(log && elementName && text);
	deMutex_lock(log->lock);

	/* Fill in attributes. */
	if (name)			attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	if (description)	attribs[numAttribs++] = qpSetStringAttrib("Description", description);
	if (tagString)		attribs[numAttribs++] = qpSetStringAttrib("Tag", tagString);
	if (unit)			attribs[numAttribs++] = qpSetStringAttrib("Unit", unit);

	if (!qpXmlWriter_startElement(log->writer, elementName, numAttribs, attribs) ||
		!qpXmlWriter_writeString(log->writer, text) ||
		!qpXmlWriter_endElement(log->writer, elementName))
	{
		qpPrintf("qpTestLog_writeKeyValuePair(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}